

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O0

string * readNumber_abi_cxx11_(void)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  string *input;
  
  std::__cxx11::string::string((string *)in_RDI);
  std::operator>>((istream *)&std::cin,(string *)in_RDI);
  while (bVar1 = isValidNumber(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)in_RDI);
    std::operator<<(poVar2," is not a valid number.\n");
    std::operator>>((istream *)&std::cin,(string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string readNumber()
{
	std::string input{};
	std::cin >> input;
	while (!isValidNumber(input))
	{
		std::cerr << input << " is not a valid number.\n";
		std::cin >> input;
	}
	return input;
}